

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void POOL_free(POOL_ctx *ctx)

{
  pthread_mutex_t *__mutex;
  POOL_job *__ptr;
  pthread_t *__ptr_00;
  ZSTD_freeFunction UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  ulong uVar2;
  
  if (ctx == (POOL_ctx *)0x0) {
    return;
  }
  __mutex = &ctx->queueMutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  ctx->shutdown = 1;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_cond_broadcast((pthread_cond_t *)&ctx->queuePushCond);
  pthread_cond_broadcast((pthread_cond_t *)&ctx->queuePopCond);
  if (ctx->threadCapacity != 0) {
    uVar2 = 0;
    do {
      pthread_join(ctx->threads[uVar2],(void **)0x0);
      uVar2 = uVar2 + 1;
    } while (uVar2 < ctx->threadCapacity);
  }
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  pthread_cond_destroy((pthread_cond_t *)&ctx->queuePushCond);
  pthread_cond_destroy((pthread_cond_t *)&ctx->queuePopCond);
  __ptr = ctx->queue;
  UNRECOVERED_JUMPTABLE = (ctx->customMem).customFree;
  pvVar1 = (ctx->customMem).opaque;
  if (__ptr != (POOL_job *)0x0) {
    if (UNRECOVERED_JUMPTABLE == (ZSTD_freeFunction)0x0) {
      free(__ptr);
    }
    else {
      (*UNRECOVERED_JUMPTABLE)(pvVar1,__ptr);
    }
    UNRECOVERED_JUMPTABLE = (ctx->customMem).customFree;
    pvVar1 = (ctx->customMem).opaque;
  }
  __ptr_00 = ctx->threads;
  if (__ptr_00 != (pthread_t *)0x0) {
    if (UNRECOVERED_JUMPTABLE == (ZSTD_freeFunction)0x0) {
      free(__ptr_00);
    }
    else {
      (*UNRECOVERED_JUMPTABLE)(pvVar1,__ptr_00);
    }
  }
  UNRECOVERED_JUMPTABLE = (ctx->customMem).customFree;
  if (UNRECOVERED_JUMPTABLE != (ZSTD_freeFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)((ctx->customMem).opaque,ctx);
    return;
  }
  free(ctx);
  return;
}

Assistant:

void POOL_free(POOL_ctx *ctx) {
    if (!ctx) { return; }
    POOL_join(ctx);
    ZSTD_pthread_mutex_destroy(&ctx->queueMutex);
    ZSTD_pthread_cond_destroy(&ctx->queuePushCond);
    ZSTD_pthread_cond_destroy(&ctx->queuePopCond);
    ZSTD_customFree(ctx->queue, ctx->customMem);
    ZSTD_customFree(ctx->threads, ctx->customMem);
    ZSTD_customFree(ctx, ctx->customMem);
}